

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_readNCount_bmi2(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,
                          void *headerBuffer,size_t hbSize,int bmi2)

{
  uint *puVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  BYTE *istart;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint *puVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint *puVar18;
  bool bVar19;
  char buffer [8];
  undefined8 local_38;
  
  if (bmi2 != 0) {
    sVar3 = FSE_readNCount_body_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,headerBuffer,hbSize);
    return sVar3;
  }
  if (hbSize < 8) {
    local_38 = 0;
    memcpy(&local_38,headerBuffer,hbSize);
    sVar4 = FSE_readNCount_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,&local_38,8,0);
    sVar3 = 0xffffffffffffffec;
    if (sVar4 <= hbSize) {
      sVar3 = sVar4;
    }
    if (0xffffffffffffff88 < sVar4) {
      sVar3 = sVar4;
    }
  }
  else {
    uVar7 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar7 * 2);
    uVar10 = *headerBuffer & 0xf;
    sVar3 = 0xffffffffffffffd4;
    if (uVar10 < 0xb) {
      uVar14 = *headerBuffer >> 4;
      *tableLogPtr = uVar10 + 5;
      iVar16 = 0x20 << (sbyte)uVar10;
      uVar12 = iVar16 + 1;
      iVar11 = uVar10 + 6;
      puVar1 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar18 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar19 = true;
      uVar10 = 4;
      uVar17 = 0;
      puVar13 = (uint *)headerBuffer;
      do {
        if (!bVar19) {
          uVar2 = 0;
          if ((~uVar14 | 0x80000000) != 0) {
            for (; ((~uVar14 | 0x80000000) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          while (0x17 < uVar2) {
            if (puVar1 < puVar13) {
              uVar10 = uVar10 + ((int)puVar13 - (int)puVar1) * 8 & 0x1f;
              puVar13 = puVar18;
            }
            else {
              puVar13 = (uint *)((long)puVar13 + 3);
            }
            uVar14 = *puVar13 >> (sbyte)uVar10;
            uVar2 = 0;
            if ((~uVar14 | 0x80000000) != 0) {
              for (; ((~uVar14 | 0x80000000) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
              }
            }
            uVar17 = uVar17 + 0x24;
          }
          uVar17 = (uVar14 >> ((byte)(uVar2 & 0xfffffffe) & 0x1f) & 3) + (uVar2 >> 1) * 3 + uVar17;
          uVar14 = uVar10 + (uVar2 & 0xfffffffe) + 2;
          if (uVar7 <= uVar17) {
LAB_001543f9:
            if (uVar12 != 1) {
              return 0xffffffffffffffec;
            }
            if (uVar7 < uVar17) {
              return 0xffffffffffffffd0;
            }
            if (0x20 < (int)uVar14) {
              return 0xffffffffffffffec;
            }
            *maxSVPtr = uVar17 - 1;
            return (long)puVar13 + ((long)((int)(uVar14 + 7) >> 3) - (long)headerBuffer);
          }
          if ((puVar1 < puVar13) && (puVar18 < (uint *)((long)puVar13 + (ulong)(uVar14 >> 3)))) {
            uVar10 = uVar14 + ((int)puVar13 - (int)puVar18) * 8 & 0x1f;
            puVar13 = puVar18;
          }
          else {
            uVar10 = uVar14 & 7;
            puVar13 = (uint *)((long)puVar13 + (ulong)(uVar14 >> 3));
          }
          uVar14 = *puVar13 >> (sbyte)uVar10;
        }
        uVar2 = iVar16 * 2 - 1;
        uVar8 = uVar2 - uVar12;
        uVar5 = iVar16 - 1U & uVar14;
        if (uVar5 < uVar8) {
          iVar9 = iVar11 + -1;
        }
        else {
          uVar14 = uVar14 & uVar2;
          if ((int)uVar14 < iVar16) {
            uVar8 = 0;
          }
          uVar5 = uVar14 - uVar8;
          iVar9 = iVar11;
        }
        uVar14 = iVar9 + uVar10;
        iVar9 = uVar5 - 1;
        iVar15 = 1 - uVar5;
        if ((int)uVar5 < 1) {
          iVar15 = iVar9;
        }
        uVar12 = uVar12 + iVar15;
        uVar6 = (ulong)uVar17;
        uVar17 = uVar17 + 1;
        normalizedCounter[uVar6] = (short)iVar9;
        bVar19 = iVar9 != 0;
        if ((int)uVar12 < iVar16) {
          if ((int)uVar12 < 2) goto LAB_001543f9;
          uVar10 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar10 == 0; uVar10 = uVar10 - 1) {
            }
          }
          iVar11 = (uVar10 ^ 0xffffffe0) + 0x21;
          iVar16 = 1 << ((byte)uVar10 & 0x1f);
        }
        if (uVar7 <= uVar17) goto LAB_001543f9;
        if ((puVar1 < puVar13) && (puVar18 < (uint *)((long)puVar13 + (long)((int)uVar14 >> 3)))) {
          uVar10 = uVar14 + ((int)puVar13 - (int)puVar18) * 8 & 0x1f;
          puVar13 = puVar18;
        }
        else {
          uVar10 = uVar14 & 7;
          puVar13 = (uint *)((long)puVar13 + (long)((int)uVar14 >> 3));
        }
        uVar14 = *puVar13 >> (sbyte)uVar10;
      } while( true );
    }
  }
  return sVar3;
}

Assistant:

size_t FSE_readNCount_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_readNCount_body_bmi2(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
    }
#endif
    (void)bmi2;
    return FSE_readNCount_body_default(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}